

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::Block::performLocalNameSearch
          (Block *this,NameSearch *search,Statement *statementToSearchUpTo)

{
  bool bVar1;
  Statement *pSVar2;
  VariableDeclaration *pVVar3;
  pool_ref<soul::AST::Statement> local_60;
  pool_ptr<soul::AST::VariableDeclaration> local_58;
  pool_ptr<soul::AST::VariableDeclaration> v;
  pool_ref<soul::AST::Statement> *s;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
  *__range3;
  pool_ptr<soul::AST::VariableDeclaration> lastMatch;
  Identifier name;
  Statement *statementToSearchUpTo_local;
  NameSearch *search_local;
  Block *this_local;
  
  if ((search->findVariables & 1U) != 0) {
    lastMatch.object =
         (VariableDeclaration *)IdentifierPath::getLastPart(&search->partiallyQualifiedPath);
    pool_ptr<soul::AST::VariableDeclaration>::pool_ptr
              ((pool_ptr<soul::AST::VariableDeclaration> *)&__range3);
    __end3 = std::
             vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
             ::begin(&this->statements);
    s = (pool_ref<soul::AST::Statement> *)
        std::
        vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
        ::end(&this->statements);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
                                       *)&s), bVar1) {
      v.object = (VariableDeclaration *)
                 __gnu_cxx::
                 __normal_iterator<const_soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
                 ::operator*(&__end3);
      pSVar2 = pool_ref<soul::AST::Statement>::getPointer
                         ((pool_ref<soul::AST::Statement> *)v.object);
      if (pSVar2 == statementToSearchUpTo) break;
      local_60.object = (Statement *)((v.object)->super_Statement).super_ASTObject._vptr_ASTObject;
      cast<soul::AST::VariableDeclaration,soul::AST::Statement>((soul *)&local_58,&local_60);
      pool_ref<soul::AST::Statement>::~pool_ref(&local_60);
      bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_58);
      if (bVar1) {
        pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&local_58);
        bVar1 = Identifier::operator==(&pVVar3->name,(Identifier *)&lastMatch);
        if (bVar1) {
          __range3 = (vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>
                      *)local_58.object;
        }
      }
      pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr(&local_58);
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::AST::Statement>_*,_std::vector<soul::pool_ref<soul::AST::Statement>,_std::allocator<soul::pool_ref<soul::AST::Statement>_>_>_>
      ::operator++(&__end3);
    }
    bVar1 = pool_ptr<soul::AST::VariableDeclaration>::operator!=
                      ((pool_ptr<soul::AST::VariableDeclaration> *)&__range3,(void *)0x0);
    if (bVar1) {
      pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator*
                         ((pool_ptr<soul::AST::VariableDeclaration> *)&__range3);
      Scope::NameSearch::addResult(search,(ASTObject *)pVVar3);
    }
    pool_ptr<soul::AST::VariableDeclaration>::~pool_ptr
              ((pool_ptr<soul::AST::VariableDeclaration> *)&__range3);
  }
  return;
}

Assistant:

void performLocalNameSearch (NameSearch& search, const Statement* statementToSearchUpTo) const override
        {
            if (search.findVariables)
            {
                auto name = search.partiallyQualifiedPath.getLastPart();
                pool_ptr<VariableDeclaration> lastMatch;

                for (auto& s : statements)
                {
                    if (s.getPointer() == statementToSearchUpTo)
                        break;

                    if (auto v = cast<VariableDeclaration> (s))
                        if (v->name == name)
                            lastMatch = v;
                }

                if (lastMatch != nullptr)
                    search.addResult (*lastMatch);
            }
        }